

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.cpp
# Opt level: O3

int omp_target_disassociate_ptr(void *host_ptr,int device_num)

{
  bool bVar1;
  int iVar2;
  
  if (device_num != -10 && host_ptr != (void *)0x0) {
    bVar1 = device_is_ready(device_num);
    if (bVar1) {
      iVar2 = DeviceTy::disassociatePtr
                        (Devices.super__Vector_base<DeviceTy,_std::allocator<DeviceTy>_>._M_impl.
                         super__Vector_impl_data._M_start + device_num,host_ptr);
      return iVar2;
    }
  }
  return -1;
}

Assistant:

EXTERN int omp_target_disassociate_ptr(void *host_ptr, int device_num) {
  DP("Call to omp_target_disassociate_ptr with host_ptr " DPxMOD ", "
      "device_num %d\n", DPxPTR(host_ptr), device_num);

  if (!host_ptr) {
    DP("Call to omp_target_associate_ptr with invalid host_ptr\n");
    return OFFLOAD_FAIL;
  }

  if (device_num == omp_get_initial_device()) {
    DP("omp_target_disassociate_ptr: no association possible on the host\n");
    return OFFLOAD_FAIL;
  }

  if (!device_is_ready(device_num)) {
    DP("omp_target_disassociate_ptr returns OFFLOAD_FAIL\n");
    return OFFLOAD_FAIL;
  }

  DeviceTy& Device = Devices[device_num];
  int rc = Device.disassociatePtr(host_ptr);
  DP("omp_target_disassociate_ptr returns %d\n", rc);
  return rc;
}